

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

void duckdb::UncompressedStringStorage::StringScanPartial
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  int iVar1;
  _func_int *p_Var2;
  idx_t iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  pointer pSVar9;
  long lVar10;
  data_ptr_t dict_end;
  _func_int *__src;
  data_ptr_t pdVar11;
  idx_t iVar12;
  undefined1 local_60 [8];
  _func_int *p_Stack_58;
  ColumnSegment *local_50;
  Vector *local_48;
  idx_t local_40;
  idx_t local_38;
  
  local_48 = result;
  local_40 = result_offset;
  pSVar9 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  iVar12 = state->row_index;
  local_38 = (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar9 + 3));
  p_Var2 = pSVar9[3]._vptr_SegmentScanState[2];
  iVar3 = segment->offset;
  local_50 = segment;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar9 + 3));
  iVar7 = 0;
  lVar10 = iVar12 - local_38;
  if (lVar10 != 0) {
    iVar7 = *(int *)(p_Var2 + lVar10 * 4 + iVar3 + 4);
  }
  if (scan_count != 0) {
    lVar6 = *(uint *)(pSVar9[3]._vptr_SegmentScanState[2] + local_50->offset + 4) + iVar3;
    lVar10 = lVar10 * 4 + iVar3 + 8;
    pdVar11 = local_48->data + local_40 * 0x10 + 8;
    iVar12 = 0;
    do {
      iVar1 = *(int *)(p_Var2 + iVar12 * 4 + lVar10);
      iVar4 = -iVar1;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      iVar5 = -iVar7;
      if (0 < iVar7) {
        iVar5 = iVar7;
      }
      if ((long)iVar1 < 0) {
        _local_60 = (anon_struct_16_3_d7536bce_for_pointer)
                    ReadOverflowString(local_50,local_48,
                                       *(block_id_t *)(p_Var2 + (lVar6 - (ulong)(uint)-iVar1)),
                                       *(int32_t *)(p_Var2 + (lVar6 - (ulong)(uint)-iVar1) + 8));
      }
      else {
        uVar8 = iVar4 - iVar5;
        __src = p_Var2 + (lVar6 - iVar1);
        if (uVar8 < 0xd) {
          _local_60 = (anon_union_16_2_67f50693_for_value)ZEXT416(uVar8);
          if (iVar4 != iVar5) {
            switchD_012dd528::default(local_60 + 4,__src,(ulong)uVar8);
          }
        }
        else {
          local_60._4_4_ = *(undefined4 *)__src;
          local_60._0_4_ = uVar8;
          p_Stack_58 = __src;
        }
      }
      *(undefined4 *)(pdVar11 + -8) = local_60._0_4_;
      *(undefined4 *)(pdVar11 + -4) = local_60._4_4_;
      *(_func_int **)pdVar11 = p_Stack_58;
      iVar7 = *(int *)(p_Var2 + iVar12 * 4 + lVar10);
      iVar12 = iVar12 + 1;
      pdVar11 = pdVar11 + 0x10;
    } while (scan_count != iVar12);
  }
  return;
}

Assistant:

void UncompressedStringStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count,
                                                  Vector &result, idx_t result_offset) {
	// clear any previously locked buffers and get the primary buffer handle
	auto &scan_state = state.scan_state->Cast<StringScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict_end = GetDictionaryEnd(segment, scan_state.handle);
	auto base_data = reinterpret_cast<int32_t *>(baseptr + DICTIONARY_HEADER_SIZE);
	auto result_data = FlatVector::GetData<string_t>(result);

	int32_t previous_offset = start > 0 ? base_data[start - 1] : 0;

	for (idx_t i = 0; i < scan_count; i++) {
		// std::abs used since offsets can be negative to indicate big strings
		auto current_offset = base_data[start + i];
		auto string_length = UnsafeNumericCast<uint32_t>(std::abs(current_offset) - std::abs(previous_offset));
		result_data[result_offset + i] =
		    FetchStringFromDict(segment, dict_end, result, baseptr, current_offset, string_length);
		previous_offset = base_data[start + i];
	}
}